

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O1

void __thiscall
VectorSUnitTest_range_assignment_Test::~VectorSUnitTest_range_assignment_Test
          (VectorSUnitTest_range_assignment_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, range_assignment)
{
    std::vector<int> v_src{0,1,2,3,4};

    vector_s<int, 10> v;
    v.assign(v_src.begin(), v_src.end());
    EXPECT_FALSE(v.empty());
    EXPECT_EQ(5u, v.size());
    EXPECT_EQ(static_cast<int>(0), v[0]);
    EXPECT_EQ(1, v[1]);
    EXPECT_EQ(2, v[2]);
    EXPECT_EQ(3, v[3]);
    EXPECT_EQ(4, v[4]);

    std::vector<std::string> vs_src{"0","1","2","3","4"};
    vector_s<std::string, 10> vs;
    vs.assign(vs_src.begin(), vs_src.end());
    EXPECT_FALSE(vs.empty());
    EXPECT_EQ(5u, vs.size());
    EXPECT_EQ(std::string("0"), vs[0]);
    EXPECT_EQ(std::string("1"), vs[1]);
    EXPECT_EQ(std::string("2"), vs[2]);
    EXPECT_EQ(std::string("3"), vs[3]);
    EXPECT_EQ(std::string("4"), vs[4]);
}